

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.cc
# Opt level: O3

int unzip(string *path)

{
  tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  this;
  ostream *poVar1;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  pointer *__ptr;
  vector<char,_std::allocator<char>_> data;
  ofstream of;
  __uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  local_2e8;
  undefined1 local_2e0 [32];
  Zip local_2c0;
  long *local_210;
  long local_208;
  long local_200 [29];
  ios_base local_118 [264];
  
  this.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
        )operator_new(0x208);
  std::ifstream::ifstream
            ((ifstream *)
             this.
             super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,(string *)path,_S_in);
  local_2e8._M_t.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
        )(tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
          )this.
           super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  Zip::Zip(&local_2c0,
           (unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
            *)&local_2e8);
  if ((_Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
       )local_2e8._M_t.
        super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
        .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
        _M_head_impl != (basic_istream<char,_std::char_traits<char>_> *)0x0) {
    (**(code **)(*(long *)local_2e8._M_t.
                          super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  local_2e8._M_t.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
        )(_Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
          )0x0;
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,local_2c0.fileName_._M_dataplus._M_p,
             local_2c0.fileName_._M_dataplus._M_p + local_2c0.fileName_._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_210,local_208);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  local_2e0._0_8_ = (basic_istream<char,_std::char_traits<char>_> *)(local_2e0 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2e0,local_2c0.fileName_._M_dataplus._M_p,
             local_2c0.fileName_._M_dataplus._M_p + local_2c0.fileName_._M_string_length);
  std::ofstream::ofstream(&local_210,(string *)local_2e0,_S_out);
  __buf = extraout_RDX;
  if ((basic_istream<char,_std::char_traits<char>_> *)local_2e0._0_8_ !=
      (basic_istream<char,_std::char_traits<char>_> *)(local_2e0 + 0x10)) {
    operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
    __buf = extraout_RDX_00;
  }
  Zip::read((Zip *)local_2e0,(int)&local_2c0,__buf,in_RCX);
  std::ostream::write((char *)&local_210,local_2e0._0_8_);
  if ((basic_istream<char,_std::char_traits<char>_> *)local_2e0._0_8_ !=
      (basic_istream<char,_std::char_traits<char>_> *)0x0) {
    operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ - local_2e0._0_8_);
  }
  local_210 = _VTT;
  *(undefined8 *)((long)&local_210 + _VTT[-3]) = __filebuf;
  std::filebuf::~filebuf((filebuf *)&local_208);
  std::ios_base::~ios_base(local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0.extraField_._M_dataplus._M_p != &local_2c0.extraField_.field_2) {
    operator_delete(local_2c0.extraField_._M_dataplus._M_p,
                    local_2c0.extraField_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0.fileName_._M_dataplus._M_p != &local_2c0.fileName_.field_2) {
    operator_delete(local_2c0.fileName_._M_dataplus._M_p,
                    local_2c0.fileName_.field_2._M_allocated_capacity + 1);
  }
  if ((_Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
       )local_2c0.is_._M_t.
        super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
        .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
        _M_head_impl != (basic_istream<char,_std::char_traits<char>_> *)0x0) {
    (**(code **)(*(long *)local_2c0.is_._M_t.
                          super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return 0;
}

Assistant:

int unzip(std::string path) {
  Zip zip(std::unique_ptr<std::istream>(new std::ifstream(path)));
  std::cout << zip.fileName() << std::endl;
  std::ofstream of(zip.fileName());
  auto data = zip.read();
  of.write(data.data(), data.size());
  return 0;
}